

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBase.cpp
# Opt level: O1

void __thiscall DataBase::DataBase(DataBase *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->updates_to_sim).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  this->in_var_map =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
        *)0x0;
  this->sim_var_map =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
        *)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->updates_to_sim,0);
  this->sim_var_index[0]._M_dataplus._M_p = (pointer)&this->sim_var_index[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this->sim_var_index,"/instrumentation/airspeed-indicator/indicated-speed-kt",
             "");
  this->sim_var_index[1]._M_dataplus._M_p = (pointer)&this->sim_var_index[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 1),"/sim/time/warp","");
  this->sim_var_index[2]._M_dataplus._M_p = (pointer)&this->sim_var_index[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 2),"/controls/switches/magnetos","");
  this->sim_var_index[3]._M_dataplus._M_p = (pointer)&this->sim_var_index[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 3),"/instrumentation/heading-indicator/offset-deg","")
  ;
  this->sim_var_index[4]._M_dataplus._M_p = (pointer)&this->sim_var_index[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 4),"/instrumentation/altimeter/indicated-altitude-ft",
             "");
  this->sim_var_index[5]._M_dataplus._M_p = (pointer)&this->sim_var_index[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 5),"/instrumentation/altimeter/pressure-alt-ft","");
  this->sim_var_index[6]._M_dataplus._M_p = (pointer)&this->sim_var_index[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 6),
             "/instrumentation/attitude-indicator/indicated-pitch-deg","");
  this->sim_var_index[7]._M_dataplus._M_p = (pointer)&this->sim_var_index[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 7),
             "/instrumentation/attitude-indicator/indicated-roll-deg","");
  this->sim_var_index[8]._M_dataplus._M_p = (pointer)&this->sim_var_index[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 8),
             "/instrumentation/attitude-indicator/internal-pitch-deg","");
  this->sim_var_index[9]._M_dataplus._M_p = (pointer)&this->sim_var_index[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 9),
             "/instrumentation/attitude-indicator/internal-roll-deg","");
  this->sim_var_index[10]._M_dataplus._M_p = (pointer)&this->sim_var_index[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 10),"/instrumentation/encoder/indicated-altitude-ft",
             "");
  this->sim_var_index[0xb]._M_dataplus._M_p = (pointer)&this->sim_var_index[0xb].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0xb),"/instrumentation/encoder/pressure-alt-ft","");
  this->sim_var_index[0xc]._M_dataplus._M_p = (pointer)&this->sim_var_index[0xc].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0xc),"/instrumentation/gps/indicated-altitude-ft","");
  this->sim_var_index[0xd]._M_dataplus._M_p = (pointer)&this->sim_var_index[0xd].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0xd),"/instrumentation/gps/indicated-ground-speed-kt",
             "");
  this->sim_var_index[0xe]._M_dataplus._M_p = (pointer)&this->sim_var_index[0xe].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0xe),"/instrumentation/gps/indicated-vertical-speed",
             "");
  this->sim_var_index[0xf]._M_dataplus._M_p = (pointer)&this->sim_var_index[0xf].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0xf),
             "/instrumentation/heading-indicator/indicated-heading-deg","");
  this->sim_var_index[0x10]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x10].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x10),
             "/instrumentation/magnetic-compass/indicated-heading-deg","");
  this->sim_var_index[0x11]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x11].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x11),
             "/instrumentation/slip-skid-ball/indicated-slip-skid","");
  this->sim_var_index[0x12]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x12].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x12),
             "/instrumentation/turn-indicator/indicated-turn-rate","");
  this->sim_var_index[0x13]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x13].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x13),
             "/instrumentation/vertical-speed-indicator/indicated-speed-fpm","");
  this->sim_var_index[0x14]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x14].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x14),"/controls/flight/aileron","");
  this->sim_var_index[0x15]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x15].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x15),"/controls/flight/elevator","");
  this->sim_var_index[0x16]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x16].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x16),"/controls/flight/rudder","");
  this->sim_var_index[0x17]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x17].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x17),"/controls/flight/flaps","");
  this->sim_var_index[0x18]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x18].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x18),"/controls/engines/engine/throttle","");
  this->sim_var_index[0x19]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x19].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x19),"/controls/engines/current-engine/throttle","");
  this->sim_var_index[0x1a]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x1a].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x1a),"/controls/switches/master-avionics","");
  this->sim_var_index[0x1b]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x1b].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x1b),"/controls/switches/starter","");
  this->sim_var_index[0x1c]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x1c].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x1c),"/engines/active-engine/auto-start","");
  this->sim_var_index[0x1d]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x1d].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x1d),"/controls/flight/speedbrake","");
  this->sim_var_index[0x1e]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x1e].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x1e),"/sim/model/c172p/brake-parking","");
  this->sim_var_index[0x1f]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x1f].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x1f),"/controls/engines/engine/primer","");
  this->sim_var_index[0x20]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x20].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x20),"/controls/engines/current-engine/mixture","");
  this->sim_var_index[0x21]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x21].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x21),"/controls/switches/master-bat","");
  this->sim_var_index[0x22]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x22].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x22),"/controls/switches/master-alt","");
  this->sim_var_index[0x23]._M_dataplus._M_p = (pointer)&this->sim_var_index[0x23].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(this->sim_var_index + 0x23),"/engines/engine/rpm","");
  this->is_running = false;
  (this->sim_var_map_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->sim_var_map_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->sim_var_map_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->sim_var_map_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->sim_var_map_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->in_var_map_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->in_var_map_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->in_var_map_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->in_var_map_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->in_var_map_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            *)operator_new(0x30);
  p_Var2 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->in_var_map = pmVar1;
  pmVar1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>_>
            *)operator_new(0x30);
  p_Var2 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl = 0;
  *(undefined8 *)&(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->sim_var_map = pmVar1;
  return;
}

Assistant:

DataBase::DataBase() {
  this->in_var_map = new map<string, Variable *>();
  this->sim_var_map = new map<string, Variable *>();
}